

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_tRNS(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  byte local_130;
  byte local_12f;
  byte local_12e;
  byte local_12d;
  byte local_12c;
  byte local_12b;
  byte local_12a;
  byte local_129;
  png_byte buf_1 [6];
  png_byte buf [2];
  png_byte readbuf [256];
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 4) == 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x10) == 0)) {
      if (png_ptr->color_type == '\0') {
        if (length != 2) {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid");
          return;
        }
        png_crc_read(png_ptr,&local_12a,2);
        png_ptr->num_trans = 1;
        (png_ptr->trans_color).gray = (ushort)local_12a * 0x100 + (ushort)local_129;
      }
      else if (png_ptr->color_type == '\x02') {
        if (length != 6) {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid");
          return;
        }
        png_crc_read(png_ptr,&local_130,6);
        png_ptr->num_trans = 1;
        (png_ptr->trans_color).red = (ushort)local_130 * 0x100 + (ushort)local_12f;
        (png_ptr->trans_color).green = (ushort)local_12e * 0x100 + (ushort)local_12d;
        (png_ptr->trans_color).blue = (ushort)local_12c * 0x100 + (ushort)local_12b;
      }
      else {
        if (png_ptr->color_type != '\x03') {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid with alpha channel");
          return;
        }
        if ((png_ptr->mode & 2) == 0) {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"out of place");
          return;
        }
        if (((png_ptr->num_palette < length) || (0x100 < length)) || (length == 0)) {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid");
          return;
        }
        png_crc_read(png_ptr,buf_1,length);
        png_ptr->num_trans = (png_uint_16)length;
      }
      iVar1 = png_crc_finish(png_ptr,0);
      if (iVar1 == 0) {
        png_set_tRNS(png_ptr,info_ptr,buf_1,(uint)png_ptr->num_trans,&png_ptr->trans_color);
      }
      else {
        png_ptr->num_trans = 0;
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"duplicate");
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error(png_ptr,"out of place");
  }
  return;
}

Assistant:

void /* PRIVATE */
png_handle_tRNS(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte readbuf[PNG_MAX_PALETTE_LENGTH];

   png_debug(1, "in png_handle_tRNS");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_tRNS) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_GRAY)
   {
      png_byte buf[2];

      if (length != 2)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }

      png_crc_read(png_ptr, buf, 2);
      png_ptr->num_trans = 1;
      png_ptr->trans_color.gray = png_get_uint_16(buf);
   }

   else if (png_ptr->color_type == PNG_COLOR_TYPE_RGB)
   {
      png_byte buf[6];

      if (length != 6)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }

      png_crc_read(png_ptr, buf, length);
      png_ptr->num_trans = 1;
      png_ptr->trans_color.red = png_get_uint_16(buf);
      png_ptr->trans_color.green = png_get_uint_16(buf + 2);
      png_ptr->trans_color.blue = png_get_uint_16(buf + 4);
   }

   else if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
   {
      if ((png_ptr->mode & PNG_HAVE_PLTE) == 0)
      {
         /* TODO: is this actually an error in the ISO spec? */
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "out of place");
         return;
      }

      if (length > (unsigned int) png_ptr->num_palette ||
         length > (unsigned int) PNG_MAX_PALETTE_LENGTH ||
         length == 0)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }

      png_crc_read(png_ptr, readbuf, length);
      png_ptr->num_trans = (png_uint_16)length;
   }

   else
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid with alpha channel");
      return;
   }

   if (png_crc_finish(png_ptr, 0) != 0)
   {
      png_ptr->num_trans = 0;
      return;
   }

   /* TODO: this is a horrible side effect in the palette case because the
    * png_struct ends up with a pointer to the tRNS buffer owned by the
    * png_info.  Fix this.
    */
   png_set_tRNS(png_ptr, info_ptr, readbuf, png_ptr->num_trans,
       &(png_ptr->trans_color));
}